

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestCaseTracking::TrackerBase::fail(TrackerBase *this)

{
  TrackerBase *in_RDI;
  
  in_RDI->m_runState = Failed;
  if (in_RDI->m_parent != (ITracker *)0x0) {
    (*in_RDI->m_parent->_vptr_ITracker[10])();
  }
  moveToParent(in_RDI);
  TrackerContext::completeCycle(in_RDI->m_ctx);
  return;
}

Assistant:

void TrackerBase::fail() {
        m_runState = Failed;
        if( m_parent )
            m_parent->markAsNeedingAnotherRun();
        moveToParent();
        m_ctx.completeCycle();
    }